

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O0

int canvas_undo_objectstate(_glist *cnv,void *z,int action)

{
  t_symbol *s;
  int argc;
  t_gobj *x_00;
  t_atom *argv;
  t_pd *x;
  _binbuf *bbuf;
  t_undo_object_state *buf;
  int action_local;
  void *z_local;
  _glist *cnv_local;
  
  x = *(t_pd **)((long)z + 0x10);
  x_00 = glist_nth(cnv,*z);
  if (action == 0) {
    binbuf_free(*(_binbuf **)((long)z + 0x10));
    binbuf_free(*(_binbuf **)((long)z + 0x18));
    freebytes(z,0x20);
  }
  else {
    if (action != 1) {
      if (action != 2) {
        return 1;
      }
      x = *(t_pd **)((long)z + 0x18);
    }
    if (x_00 != (t_gobj *)0x0) {
      s = *(t_symbol **)((long)z + 8);
      argc = binbuf_getnatom((_binbuf *)x);
      argv = binbuf_getvec((_binbuf *)x);
      pd_typedmess(&x_00->g_pd,s,argc,argv);
    }
  }
  return 1;
}

Assistant:

int canvas_undo_objectstate(t_canvas *cnv, void *z, int action) {
    t_undo_object_state *buf = z;
    t_binbuf*bbuf = buf->u_undo;
    t_pd*x = (t_pd*)glist_nth(cnv, buf->u_obj);
    switch(action) {
    case UNDO_FREE:
        binbuf_free(buf->u_undo);
        binbuf_free(buf->u_redo);
        t_freebytes(buf, sizeof(*buf));
        break;
    case UNDO_REDO:
        bbuf = buf->u_redo;     /* falls through */
    case UNDO_UNDO:
        if(x)
            pd_typedmess(x, buf->u_symbol, binbuf_getnatom(bbuf), binbuf_getvec(bbuf));
        break;
    }
    return 1;
}